

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void appendRowsToLpVectors
               (HighsLp *lp,HighsInt num_new_row,vector<double,_std::allocator<double>_> *rowLower,
               vector<double,_std::allocator<double>_> *rowUpper)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  reference this;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  HighsInt iRow;
  HighsInt new_row;
  bool have_names;
  HighsInt new_num_row;
  int local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar6;
  
  if (in_ESI != 0) {
    iVar2 = *(int *)(in_RDI + 4) + in_ESI;
    std::vector<double,_std::allocator<double>_>::resize
              (in_RCX,CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    std::vector<double,_std::allocator<double>_>::resize
              (in_RCX,CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x160));
    uVar6 = CONCAT13(sVar3 != 0,(int3)in_stack_ffffffffffffffd8);
    if (sVar3 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RCX,CONCAT44(iVar2,uVar6));
    }
    for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
      iVar2 = *(int *)(in_RDI + 4) + local_2c;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_2c);
      vVar1 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar2);
      *pvVar5 = vVar1;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_2c);
      vVar1 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar2);
      *pvVar5 = vVar1;
      if ((uVar6 & 0x1000000) != 0) {
        this = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RDI + 0x160),(long)iVar2);
        std::__cxx11::string::operator=((string *)this,"");
      }
    }
  }
  return;
}

Assistant:

void appendRowsToLpVectors(HighsLp& lp, const HighsInt num_new_row,
                           const vector<double>& rowLower,
                           const vector<double>& rowUpper) {
  assert(num_new_row >= 0);
  if (num_new_row == 0) return;
  HighsInt new_num_row = lp.num_row_ + num_new_row;
  lp.row_lower_.resize(new_num_row);
  lp.row_upper_.resize(new_num_row);
  bool have_names = (lp.row_names_.size() != 0);
  if (have_names) lp.row_names_.resize(new_num_row);

  for (HighsInt new_row = 0; new_row < num_new_row; new_row++) {
    HighsInt iRow = lp.num_row_ + new_row;
    lp.row_lower_[iRow] = rowLower[new_row];
    lp.row_upper_[iRow] = rowUpper[new_row];
    // Cannot guarantee to create unique names, so name is blank
    if (have_names) lp.row_names_[iRow] = "";
  }
}